

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O3

Nf_Man_t * Nf_StoCreate(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  uint uVar1;
  Jf_Par_t *pJVar2;
  Mio_Cell2_t *pMVar3;
  undefined1 auVar4 [16];
  int iVar5;
  Nf_Man_t *pNVar6;
  Nf_Obj_t *pNVar7;
  void **ppvVar8;
  int *piVar9;
  float *pfVar10;
  Vec_Int_t *pVVar11;
  Mio_Library_t *pLib;
  abctime aVar12;
  long lVar13;
  ulong uVar14;
  size_t sVar15;
  int iVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar22;
  timespec ts;
  
  if (0x1e < pPars->nCutNum - 2U) {
    __assert_fail("pPars->nCutNum > 1 && pPars->nCutNum <= NF_CUT_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                  ,0x172,"Nf_Man_t *Nf_StoCreate(Gia_Man_t *, Jf_Par_t *)");
  }
  if (4 < pPars->nLutSize - 2U) {
    __assert_fail("pPars->nLutSize > 1 && pPars->nLutSize <= NF_LEAF_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                  ,0x173,"Nf_Man_t *Nf_StoCreate(Gia_Man_t *, Jf_Par_t *)");
  }
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  pVVar11 = pGia->vCellMapping;
  if (pVVar11 != (Vec_Int_t *)0x0) {
    if (pVVar11->pArray != (int *)0x0) {
      free(pVVar11->pArray);
      pGia->vCellMapping->pArray = (int *)0x0;
      pVVar11 = pGia->vCellMapping;
      if (pVVar11 == (Vec_Int_t *)0x0) goto LAB_00732dac;
    }
    free(pVVar11);
    pGia->vCellMapping = (Vec_Int_t *)0x0;
  }
LAB_00732dac:
  if (pGia->pSibls != (int *)0x0) {
    Gia_ManSetPhase(pGia);
  }
  pNVar6 = (Nf_Man_t *)calloc(1,0x120);
  iVar5 = clock_gettime(3,(timespec *)&ts);
  if (iVar5 < 0) {
    aVar12 = -1;
  }
  else {
    aVar12 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  pNVar6->clkStart = aVar12;
  pNVar6->pGia = pGia;
  pNVar6->pPars = pPars;
  iVar5 = pGia->nObjs;
  pNVar7 = (Nf_Obj_t *)calloc((long)iVar5,0x40);
  pNVar6->pNfObjs = pNVar7;
  pNVar6->iCur = 2;
  if ((pNVar6->vPages).nCap < 0x100) {
    ppvVar8 = (pNVar6->vPages).pArray;
    if (ppvVar8 == (void **)0x0) {
      ppvVar8 = (void **)malloc(0x800);
    }
    else {
      ppvVar8 = (void **)realloc(ppvVar8,0x800);
      iVar5 = pGia->nObjs;
    }
    (pNVar6->vPages).pArray = ppvVar8;
    (pNVar6->vPages).nCap = 0x100;
  }
  uVar1 = iVar5 * 2;
  iVar16 = (pNVar6->vMapRefs).nCap;
  if (SBORROW4(iVar16,uVar1) != iVar16 + iVar5 * -2 < 0) {
    piVar9 = (pNVar6->vMapRefs).pArray;
    if (piVar9 == (int *)0x0) {
      piVar9 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar9 = (int *)realloc(piVar9,(long)(int)uVar1 << 2);
    }
    (pNVar6->vMapRefs).pArray = piVar9;
    if (piVar9 == (int *)0x0) goto LAB_00733301;
    (pNVar6->vMapRefs).nCap = uVar1;
  }
  if (0 < iVar5) {
    memset((pNVar6->vMapRefs).pArray,0,(ulong)uVar1 << 2);
  }
  (pNVar6->vMapRefs).nSize = uVar1;
  iVar5 = pGia->nObjs;
  uVar14 = (long)iVar5 * 2;
  iVar16 = (int)uVar14;
  if ((pNVar6->vFlowRefs).nCap < iVar16) {
    pfVar10 = (pNVar6->vFlowRefs).pArray;
    sVar15 = (long)iVar5 << 3;
    if (pfVar10 == (float *)0x0) {
      pfVar10 = (float *)malloc(sVar15);
    }
    else {
      pfVar10 = (float *)realloc(pfVar10,sVar15);
    }
    (pNVar6->vFlowRefs).pArray = pfVar10;
    (pNVar6->vFlowRefs).nCap = iVar16;
  }
  if (0 < iVar5) {
    memset((pNVar6->vFlowRefs).pArray,0,(uVar14 & 0xffffffff) << 2);
  }
  (pNVar6->vFlowRefs).nSize = iVar16;
  iVar5 = pGia->nObjs;
  uVar14 = (long)iVar5 * 2;
  iVar16 = (int)uVar14;
  if ((pNVar6->vRequired).nCap < iVar16) {
    piVar9 = (pNVar6->vRequired).pArray;
    sVar15 = (long)iVar5 << 3;
    if (piVar9 == (int *)0x0) {
      piVar9 = (int *)malloc(sVar15);
    }
    else {
      piVar9 = (int *)realloc(piVar9,sVar15);
    }
    (pNVar6->vRequired).pArray = piVar9;
    if (piVar9 == (int *)0x0) goto LAB_00733301;
    (pNVar6->vRequired).nCap = iVar16;
  }
  auVar4 = _DAT_008403e0;
  if (0 < iVar5) {
    piVar9 = (pNVar6->vRequired).pArray;
    lVar13 = (uVar14 & 0xffffffff) - 1;
    auVar18._8_4_ = (int)lVar13;
    auVar18._0_8_ = lVar13;
    auVar18._12_4_ = (int)((ulong)lVar13 >> 0x20);
    uVar14 = 0;
    auVar18 = auVar18 ^ _DAT_008403e0;
    auVar19 = _DAT_008403c0;
    auVar20 = _DAT_008403d0;
    do {
      auVar21 = auVar20 ^ auVar4;
      iVar5 = auVar18._4_4_;
      if ((bool)(~(auVar21._4_4_ == iVar5 && auVar18._0_4_ < auVar21._0_4_ || iVar5 < auVar21._4_4_)
                & 1)) {
        piVar9[uVar14] = 0x3fffffff;
      }
      if ((auVar21._12_4_ != auVar18._12_4_ || auVar21._8_4_ <= auVar18._8_4_) &&
          auVar21._12_4_ <= auVar18._12_4_) {
        piVar9[uVar14 + 1] = 0x3fffffff;
      }
      auVar21 = auVar19 ^ auVar4;
      iVar22 = auVar21._4_4_;
      if (iVar22 <= iVar5 && (iVar22 != iVar5 || auVar21._0_4_ <= auVar18._0_4_)) {
        piVar9[uVar14 + 2] = 0x3fffffff;
        piVar9[uVar14 + 3] = 0x3fffffff;
      }
      uVar14 = uVar14 + 4;
      lVar13 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 4;
      auVar20._8_8_ = lVar13 + 4;
      lVar13 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 4;
      auVar19._8_8_ = lVar13 + 4;
    } while ((iVar16 + 3U & 0xfffffffc) != uVar14);
  }
  (pNVar6->vRequired).nSize = iVar16;
  uVar1 = pGia->nObjs;
  if ((pNVar6->vCutSets).nCap < (int)uVar1) {
    piVar9 = (pNVar6->vCutSets).pArray;
    if (piVar9 == (int *)0x0) {
      piVar9 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar9 = (int *)realloc(piVar9,(long)(int)uVar1 << 2);
    }
    (pNVar6->vCutSets).pArray = piVar9;
    if (piVar9 == (int *)0x0) goto LAB_00733301;
    (pNVar6->vCutSets).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((pNVar6->vCutSets).pArray,0,(ulong)uVar1 * 4);
  }
  (pNVar6->vCutSets).nSize = uVar1;
  uVar1 = pGia->nObjs;
  if ((pNVar6->vCutFlows).nCap < (int)uVar1) {
    pfVar10 = (pNVar6->vCutFlows).pArray;
    if (pfVar10 == (float *)0x0) {
      pfVar10 = (float *)malloc((long)(int)uVar1 << 2);
    }
    else {
      pfVar10 = (float *)realloc(pfVar10,(long)(int)uVar1 << 2);
    }
    (pNVar6->vCutFlows).pArray = pfVar10;
    (pNVar6->vCutFlows).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((pNVar6->vCutFlows).pArray,0,(ulong)uVar1 * 4);
  }
  (pNVar6->vCutFlows).nSize = uVar1;
  uVar1 = pGia->nObjs;
  if ((pNVar6->vCutDelays).nCap < (int)uVar1) {
    piVar9 = (pNVar6->vCutDelays).pArray;
    if (piVar9 == (int *)0x0) {
      piVar9 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar9 = (int *)realloc(piVar9,(long)(int)uVar1 << 2);
    }
    (pNVar6->vCutDelays).pArray = piVar9;
    if (piVar9 == (int *)0x0) goto LAB_00733301;
    (pNVar6->vCutDelays).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((pNVar6->vCutDelays).pArray,0,(ulong)uVar1 * 4);
  }
  (pNVar6->vCutDelays).nSize = uVar1;
  if ((pNVar6->vBackup).nCap < 1000) {
    piVar9 = (pNVar6->vBackup).pArray;
    if (piVar9 == (int *)0x0) {
      piVar9 = (int *)malloc(4000);
    }
    else {
      piVar9 = (int *)realloc(piVar9,4000);
    }
    (pNVar6->vBackup).pArray = piVar9;
    if (piVar9 == (int *)0x0) {
LAB_00733301:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (pNVar6->vBackup).nCap = 1000;
  }
  pVVar11 = (Vec_Int_t *)calloc(1,0x10);
  Mf_ManSetFlowRefs(pGia,pVVar11);
  iVar5 = pVVar11->nSize;
  piVar9 = pVVar11->pArray;
  if ((long)iVar5 < 1) {
    if (piVar9 == (int *)0x0) goto LAB_0073324b;
  }
  else {
    uVar1 = (pNVar6->vFlowRefs).nSize;
    lVar13 = 0;
    do {
      if ((int)uVar1 <= lVar13) {
LAB_007332e2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecFlt.h"
                      ,0x184,"void Vec_FltWriteEntry(Vec_Flt_t *, int, float)");
      }
      fVar17 = (float)*(int *)((long)piVar9 + lVar13 * 2);
      pfVar10 = (pNVar6->vFlowRefs).pArray;
      pfVar10[lVar13] = fVar17;
      if ((ulong)uVar1 <= lVar13 + 1U) goto LAB_007332e2;
      pfVar10[lVar13 + 1] = fVar17;
      lVar13 = lVar13 + 2;
    } while ((long)iVar5 * 2 != lVar13);
  }
  free(piVar9);
LAB_0073324b:
  free(pVVar11);
  pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
  pJVar2 = pNVar6->pPars;
  Mio_LibraryMatchesFetch
            (pLib,&pNVar6->vTtMem,&pNVar6->vTt2Match,&pNVar6->pCells,&pNVar6->nCells,
             pJVar2->fPinFilter,pJVar2->fPinPerm,pJVar2->fPinQuick);
  pMVar3 = pNVar6->pCells;
  pNVar6->InvDelayI = pMVar3[3].iDelays[0];
  pNVar6->InvAreaW = pMVar3[3].AreaW;
  pNVar6->InvAreaF = pMVar3[3].AreaF;
  *(uint *)pNVar6->pNfObjs->M[0] = *(uint *)pNVar6->pNfObjs->M[0] & 0xfff00000;
  *(uint *)pNVar6->pNfObjs->M[1] = (*(uint *)pNVar6->pNfObjs->M[1] & 0xfff00000) + 1;
  return pNVar6;
}

Assistant:

Nf_Man_t * Nf_StoCreate( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    extern void Mf_ManSetFlowRefs( Gia_Man_t * p, Vec_Int_t * vRefs );
    Vec_Int_t * vFlowRefs;
    Nf_Man_t * p;
    int i, Entry;
    assert( pPars->nCutNum > 1  && pPars->nCutNum <= NF_CUT_MAX );
    assert( pPars->nLutSize > 1 && pPars->nLutSize <= NF_LEAF_MAX );
    ABC_FREE( pGia->pRefs );
    Vec_IntFreeP( &pGia->vCellMapping );
    if ( Gia_ManHasChoices(pGia) )
        Gia_ManSetPhase(pGia);
    // create
    p = ABC_CALLOC( Nf_Man_t, 1 );
    p->clkStart = Abc_Clock();
    p->pGia     = pGia;
    p->pPars    = pPars;
    p->pNfObjs  = ABC_CALLOC( Nf_Obj_t, Gia_ManObjNum(pGia) );
    p->iCur     = 2;
    // other
    Vec_PtrGrow( &p->vPages, 256 );                                    // cut memory
    Vec_IntFill( &p->vMapRefs,  2*Gia_ManObjNum(pGia), 0 );            // mapping refs   (2x)
    Vec_FltFill( &p->vFlowRefs, 2*Gia_ManObjNum(pGia), 0 );            // flow refs      (2x)
    Vec_IntFill( &p->vRequired, 2*Gia_ManObjNum(pGia), SCL_INFINITY ); // required times (2x)
    Vec_IntFill( &p->vCutSets,  Gia_ManObjNum(pGia), 0 );              // cut offsets
    Vec_FltFill( &p->vCutFlows, Gia_ManObjNum(pGia), 0 );              // cut area
    Vec_IntFill( &p->vCutDelays,Gia_ManObjNum(pGia), 0 );              // cut delay
    Vec_IntGrow( &p->vBackup, 1000 );
    // references
    vFlowRefs = Vec_IntAlloc(0);
    Mf_ManSetFlowRefs( pGia, vFlowRefs );
    Vec_IntForEachEntry( vFlowRefs, Entry, i )
    {
        Vec_FltWriteEntry( &p->vFlowRefs, 2*i,   /*0.5* */Entry );
        Vec_FltWriteEntry( &p->vFlowRefs, 2*i+1, /*0.5* */Entry );
    }
    Vec_IntFree(vFlowRefs);
    // matching
    Mio_LibraryMatchesFetch( (Mio_Library_t *)Abc_FrameReadLibGen(), &p->vTtMem, &p->vTt2Match, &p->pCells, &p->nCells, p->pPars->fPinFilter, p->pPars->fPinPerm, p->pPars->fPinQuick );
    p->InvDelayI = p->pCells[3].iDelays[0];
    p->InvAreaW  = p->pCells[3].AreaW;
    p->InvAreaF  = p->pCells[3].AreaF;
    Nf_ObjMatchD(p, 0, 0)->Gate = 0;
    Nf_ObjMatchD(p, 0, 1)->Gate = 1;
    // prepare cuts
    return p;
}